

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_add(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  REF_GLOB *pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  REF_STATUS ref_private_macro_code_rxs;
  
  if (global < 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x150,
           "ref_node_add",3,"invalid global node");
    return 3;
  }
  uVar3 = ref_node_local(ref_node,global,node);
  if (uVar3 != 0) {
    if (uVar3 != 5) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x154,
             "ref_node_add",(ulong)uVar3,"ref_node_local unexpected status");
      return uVar3;
    }
    uVar3 = ref_node_add_core(ref_node,global,node);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x156,
             "ref_node_add",(ulong)uVar3,"core");
      return uVar3;
    }
    iVar4 = ref_node->n;
    if (1 < (long)iVar4) {
      uVar7 = (ulong)(iVar4 - 1);
      do {
        uVar3 = (uint)uVar7;
        uVar7 = (ulong)(uVar3 - 1);
        if (ref_node->sorted_global[uVar7] < global) goto LAB_001ab673;
      } while (0 < (int)(uVar3 - 1));
    }
    uVar3 = 0;
LAB_001ab673:
    lVar6 = (long)iVar4 + -1;
    iVar5 = (int)lVar6;
    if ((int)uVar3 < iVar5) {
      pRVar1 = ref_node->sorted_global;
      iVar8 = iVar4;
      do {
        pRVar1[lVar6] = pRVar1[(long)iVar8 + -2];
        lVar6 = lVar6 + -1;
        iVar8 = iVar8 + -1;
      } while ((int)uVar3 < lVar6);
    }
    if ((int)uVar3 < iVar4 + -1) {
      pRVar2 = ref_node->sorted_local;
      lVar6 = (long)iVar5;
      do {
        pRVar2[lVar6] = pRVar2[(long)iVar4 + -2];
        lVar6 = lVar6 + -1;
        iVar4 = iVar4 + -1;
      } while ((int)uVar3 < lVar6);
    }
    ref_node->sorted_global[uVar3] = global;
    ref_node->sorted_local[uVar3] = *node;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_add(REF_NODE ref_node, REF_GLOB global,
                                REF_INT *node) {
  REF_INT location, insert_point;
  REF_STATUS status;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  status = ref_node_local(ref_node, global, node);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  RXS(status, REF_NOT_FOUND, "ref_node_local unexpected status");

  RSS(ref_node_add_core(ref_node, global, node), "core");

  /* general case of non-ascending global node, requires:
     search and shift (but looks to see if bigger than last early) */
  insert_point = 0;
  for (location = ref_node_n(ref_node) - 2; location >= 0; location--) {
    if (ref_node->sorted_global[location] < global) {
      insert_point = location + 1;
      break;
    }
  }

  /* shift down to clear insert_point */
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_global[location] = ref_node->sorted_global[location - 1];
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_local[location] = ref_node->sorted_local[location - 1];

  /* insert in empty location */
  ref_node->sorted_global[insert_point] = global;
  ref_node->sorted_local[insert_point] = *node;

  return REF_SUCCESS;
}